

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void collectvalidlines(lua_State *L,Closure *f)

{
  Proto *p_00;
  StkId pSVar1;
  Table *t_00;
  bool bVar2;
  undefined1 local_58 [8];
  TValue v;
  int i;
  Table *x_;
  TValue *io;
  Table *t;
  int currentline;
  Proto *p;
  Closure *f_local;
  lua_State *L_local;
  
  if ((f == (Closure *)0x0) || ((f->c).tt != '\x06')) {
    *(undefined1 *)((L->top).offset + 8) = 0;
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  else {
    p_00 = (f->l).p;
    t._4_4_ = p_00->linedefined;
    t_00 = luaH_new(L);
    pSVar1 = (L->top).p;
    *(Table **)pSVar1 = t_00;
    (pSVar1->val).tt_ = 'E';
    (L->top).p = (StkId)((L->top).offset + 0x10);
    if (p_00->lineinfo != (ls_byte *)0x0) {
      v.value_.ub = '\x11';
      bVar2 = p_00->is_vararg != '\0';
      if (bVar2) {
        t._4_4_ = nextline(p_00,t._4_4_,0);
      }
      v._13_3_ = 0;
      v._12_1_ = bVar2;
      for (; (int)v._12_4_ < p_00->sizelineinfo; v._12_4_ = v._12_4_ + 1) {
        t._4_4_ = nextline(p_00,t._4_4_,v._12_4_);
        luaH_setint(L,t_00,(long)t._4_4_,(TValue *)local_58);
      }
    }
  }
  return;
}

Assistant:

static void collectvalidlines (lua_State *L, Closure *f) {
  if (!LuaClosure(f)) {
    setnilvalue(s2v(L->top.p));
    api_incr_top(L);
  }
  else {
    const Proto *p = f->l.p;
    int currentline = p->linedefined;
    Table *t = luaH_new(L);  /* new table to store active lines */
    sethvalue2s(L, L->top.p, t);  /* push it on stack */
    api_incr_top(L);
    if (p->lineinfo != NULL) {  /* proto with debug information? */
      int i;
      TValue v;
      setbtvalue(&v);  /* boolean 'true' to be the value of all indices */
      if (!p->is_vararg)  /* regular function? */
        i = 0;  /* consider all instructions */
      else {  /* vararg function */
        lua_assert(GET_OPCODE(p->code[0]) == OP_VARARGPREP);
        currentline = nextline(p, currentline, 0);
        i = 1;  /* skip first instruction (OP_VARARGPREP) */
      }
      for (; i < p->sizelineinfo; i++) {  /* for each instruction */
        currentline = nextline(p, currentline, i);  /* get its line */
        luaH_setint(L, t, currentline, &v);  /* table[line] = true */
      }
    }
  }
}